

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_threeExpectedAndActual_Test::testBody
          (TEST_MockCallTest_threeExpectedAndActual_Test *this)

{
  MockSupport *pMVar1;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_MockCallTest_threeExpectedAndActual_Test *local_10;
  TEST_MockCallTest_threeExpectedAndActual_Test *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"");
  pMVar1 = mock(&local_20,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_40,"function1");
  (*pMVar1->_vptr_MockSupport[3])(pMVar1,local_40);
  SimpleString::~SimpleString(local_40);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(&local_50,"");
  pMVar1 = mock(&local_50,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_60,"function2");
  (*pMVar1->_vptr_MockSupport[3])(pMVar1,&local_60);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_50);
  SimpleString::SimpleString(&local_70,"");
  pMVar1 = mock(&local_70,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_80,"function3");
  (*pMVar1->_vptr_MockSupport[3])(pMVar1,&local_80);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  SimpleString::SimpleString(&local_90,"");
  pMVar1 = mock(&local_90,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"function1");
  (*pMVar1->_vptr_MockSupport[6])(pMVar1,&local_a0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  SimpleString::SimpleString(&local_b0,"");
  pMVar1 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_c0,"function2");
  (*pMVar1->_vptr_MockSupport[6])(pMVar1,&local_c0);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_d0,"");
  pMVar1 = mock(&local_d0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_e0,"function3");
  (*pMVar1->_vptr_MockSupport[6])(pMVar1,&local_e0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::SimpleString(&local_f0,"");
  pMVar1 = mock(&local_f0,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_f0);
  return;
}

Assistant:

TEST(MockCallTest, threeExpectedAndActual)
{
    mock().expectOneCall("function1");
    mock().expectOneCall("function2");
    mock().expectOneCall("function3");
    mock().actualCall("function1");
    mock().actualCall("function2");
    mock().actualCall("function3");

    mock().checkExpectations();
}